

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  int iVar1;
  ulong uVar2;
  value_type vVar3;
  ulong uVar4;
  ulong uVar5;
  value_type *pvVar6;
  value_type vVar7;
  int iVar8;
  value_type *pvVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  byte bVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  size_t sVar17;
  bool bVar18;
  value_type avStack_58 [40];
  char_type buffer [26];
  
  pvVar9 = (it->super_truncating_iterator_base<char_*>).out_;
  uVar2 = (it->super_truncating_iterator_base<char_*>).limit_;
  sVar17 = (it->super_truncating_iterator_base<char_*>).count_;
  vVar7 = it->blackhole_;
  uVar5 = *(ulong *)this;
  iVar1 = *(int *)(this + 8);
  pvVar6 = avStack_58 + iVar1;
  if (uVar5 < 100) {
    bVar18 = false;
  }
  else {
    iVar8 = -1;
    uVar16 = 1;
    iVar11 = -2;
    uVar12 = 2;
    uVar14 = uVar5;
    do {
      uVar5 = uVar14 / 100;
      uVar4 = (ulong)(uint)(((int)uVar14 + (int)uVar5 * -100) * 2);
      pvVar6[-1] = internal::basic_data<void>::DIGITS[uVar4 + 1];
      lVar10 = -1;
      if ((int)(uVar16 / 3) * 3 + iVar8 == 0) {
        *(num_writer *)(pvVar6 + -2) = this[0xc];
        lVar10 = -2;
      }
      pvVar6[lVar10 + -1] = internal::basic_data<void>::DIGITS[uVar4];
      if ((int)(uVar12 / 3) * 3 + iVar11 == 0) {
        *(num_writer *)(pvVar6 + lVar10 + -2) = this[0xc];
        lVar10 = lVar10 + -2;
      }
      else {
        lVar10 = lVar10 + -1;
      }
      pvVar6 = pvVar6 + lVar10;
      iVar8 = iVar8 + -2;
      uVar15 = (int)uVar16 + 2;
      uVar16 = (ulong)uVar15;
      iVar11 = iVar11 + -2;
      uVar12 = (ulong)((int)uVar12 + 2);
      bVar18 = 9999 < uVar14;
      uVar14 = uVar5;
    } while (bVar18);
    bVar18 = iVar8 + (uVar15 / 3) * 3 == 0;
  }
  if (uVar5 < 10) {
    bVar13 = (byte)uVar5 | 0x30;
  }
  else {
    pvVar6[-1] = internal::basic_data<void>::DIGITS[(uVar5 * 2 & 0xffffffff) + 1];
    lVar10 = -1;
    if (bVar18) {
      *(num_writer *)(pvVar6 + -2) = this[0xc];
      lVar10 = -2;
    }
    pvVar6 = pvVar6 + lVar10;
    bVar13 = internal::basic_data<void>::DIGITS[uVar5 * 2 & 0x1fffffffe];
  }
  pvVar6[-1] = bVar13;
  if (0 < iVar1) {
    lVar10 = 0;
    do {
      vVar3 = avStack_58[lVar10];
      if (sVar17 + lVar10 < uVar2) {
        *pvVar9 = avStack_58[lVar10];
        vVar3 = vVar7;
      }
      vVar7 = vVar3;
      pvVar9 = pvVar9 + (sVar17 + lVar10 < uVar2);
      lVar10 = lVar10 + 1;
    } while (iVar1 != lVar10);
    sVar17 = sVar17 + lVar10;
  }
  (it->super_truncating_iterator_base<char_*>).out_ = pvVar9;
  (it->super_truncating_iterator_base<char_*>).limit_ = uVar2;
  (it->super_truncating_iterator_base<char_*>).count_ = sVar17;
  it->blackhole_ = vVar7;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }